

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O1

void __thiscall
duckdb::ChimpGroupState<unsigned_long>::LoadValues
          (ChimpGroupState<unsigned_long> *this,unsigned_long *result,idx_t count)

{
  unsigned_long uVar1;
  idx_t iVar2;
  
  if (count != 0) {
    iVar2 = 0;
    do {
      if ((this->chimp_state).first == true) {
        uVar1 = Chimp128Decompression<unsigned_long>::LoadFirst(&this->chimp_state);
      }
      else {
        uVar1 = Chimp128Decompression<unsigned_long>::DecompressValue
                          (this->flags[iVar2],this->leading_zeros,&this->leading_zero_index,
                           this->unpacked_data_blocks,&this->unpacked_index,&this->chimp_state);
      }
      result[iVar2] = uVar1;
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  return;
}

Assistant:

void LoadValues(CHIMP_TYPE *result, idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			result[i] = Chimp128Decompression<CHIMP_TYPE>::Load(flags[i], leading_zeros, leading_zero_index,
			                                                    unpacked_data_blocks, unpacked_index, chimp_state);
		}
	}